

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_compress4X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int flags)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  ulong srcSize_00;
  void *pvVar5;
  void *dst_00;
  
  if (srcSize < 0xc || dstSize < 0x11) {
    sVar3 = 0;
  }
  else {
    if ((long)dstSize < 6) {
      __assert_fail("op <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3f5a,
                    "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                   );
    }
    srcSize_00 = srcSize + 3 >> 2;
    dst_00 = (void *)((long)dst + 6);
    sVar2 = HUF_compress1X_usingCTable_internal(dst_00,dstSize - 6,src,srcSize_00,CTable,flags);
    if (sVar2 < 0xffffffffffffff89) {
      if (sVar2 - 0x10000 < 0xffffffffffff0001) {
        bVar1 = false;
        sVar2 = 0;
      }
      else {
        *(short *)dst = (short)sVar2;
        dst_00 = (void *)((long)dst_00 + sVar2);
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
    sVar3 = sVar2;
    if (bVar1) {
      pvVar5 = (void *)(dstSize + (long)dst);
      if (pvVar5 < dst_00) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3f62,
                      "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                     );
      }
      sVar3 = HUF_compress1X_usingCTable_internal
                        (dst_00,(long)pvVar5 - (long)dst_00,(void *)((long)src + srcSize_00),
                         srcSize_00,CTable,flags);
      if (sVar3 < 0xffffffffffffff89) {
        if (sVar3 - 0x10000 < 0xffffffffffff0001) {
          bVar1 = false;
          sVar3 = 0;
        }
        else {
          *(short *)((long)dst + 2) = (short)sVar3;
          dst_00 = (void *)((long)dst_00 + sVar3);
          bVar1 = true;
          sVar3 = sVar2;
        }
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
        if (pvVar5 < dst_00) {
          __assert_fail("op <= oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3f6a,
                        "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                       );
        }
        pvVar4 = (void *)((long)((long)src + srcSize_00) + srcSize_00);
        sVar2 = HUF_compress1X_usingCTable_internal
                          (dst_00,(long)pvVar5 - (long)dst_00,pvVar4,srcSize_00,CTable,flags);
        if (sVar2 < 0xffffffffffffff89) {
          if (sVar2 - 0x10000 < 0xffffffffffff0001) {
            bVar1 = false;
            sVar3 = 0;
          }
          else {
            *(short *)((long)dst + 4) = (short)sVar2;
            dst_00 = (void *)((long)dst_00 + sVar2);
            bVar1 = true;
          }
        }
        else {
          bVar1 = false;
          sVar3 = sVar2;
        }
        if (bVar1) {
          if (pvVar5 < dst_00) {
            __assert_fail("op <= oend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x3f72,
                          "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                         );
          }
          pvVar4 = (void *)((long)pvVar4 + srcSize_00);
          if ((void *)((long)src + srcSize) < pvVar4) {
            __assert_fail("ip <= iend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x3f73,
                          "size_t HUF_compress4X_usingCTable_internal(void *, size_t, const void *, size_t, const HUF_CElt *, int)"
                         );
          }
          sVar2 = HUF_compress1X_usingCTable_internal
                            (dst_00,(long)pvVar5 - (long)dst_00,pvVar4,
                             (long)((long)src + srcSize) - (long)pvVar4,CTable,flags);
          if (sVar2 < 0xffffffffffffff89) {
            if (sVar2 - 0x10000 < 0xffffffffffff0001) {
              bVar1 = false;
              sVar3 = 0;
            }
            else {
              dst_00 = (void *)((long)dst_00 + sVar2);
              bVar1 = true;
            }
          }
          else {
            bVar1 = false;
            sVar3 = sVar2;
          }
          if (bVar1) {
            sVar3 = (long)dst_00 - (long)dst;
          }
        }
      }
    }
  }
  return sVar3;
}

Assistant:

static size_t
HUF_compress4X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, int flags)
{
    size_t const segmentSize = (srcSize+3)/4;   /* first 3 segments */
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    BYTE* const ostart = (BYTE*) dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    if (dstSize < 6 + 1 + 1 + 1 + 8) return 0;   /* minimum space to compress successfully */
    if (srcSize < 12) return 0;   /* no saving possible : too small input */
    op += 6;   /* jumpTable */

    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart+2, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart+4, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    assert(ip <= iend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, (size_t)(iend-ip), CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        op += cSize;
    }

    return (size_t)(op-ostart);
}